

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

Status __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::load(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *this,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             **matrix,int dm)

{
  U *pUVar1;
  Col *pCVar2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  undefined8 uVar6;
  Tolerances *pTVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  SPxOut *pSVar9;
  Real RVar10;
  char cVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  fpclass_type fVar16;
  int iVar17;
  ulong uVar18;
  undefined1 uVar19;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *th;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *th_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *th_01;
  int32_t iVar20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> vv;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lastStability;
  cpp_dec_float<50U,_int,_void> local_398;
  cpp_dec_float<50U,_int,_void> local_358;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_318;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **local_310;
  uint local_308 [2];
  uint auStack_300 [2];
  uint local_2f8 [2];
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_298;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  int local_230;
  undefined1 local_22c;
  fpclass_type local_228;
  int32_t local_224;
  soplex local_218 [8];
  uint auStack_210 [2];
  uint local_208 [2];
  undefined8 uStack_200;
  undefined8 local_1f8;
  int local_1f0;
  undefined1 local_1ec;
  fpclass_type local_1e8;
  int32_t local_1e4;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  int local_1b0;
  undefined1 local_1ac;
  fpclass_type local_1a8;
  int32_t local_1a4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_158;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined5 uStack_100;
  undefined3 uStack_fb;
  undefined5 uStack_f8;
  undefined8 uStack_f3;
  undefined8 local_e8;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  undefined8 local_68;
  uint auStack_60 [4];
  undefined5 uStack_50;
  undefined3 uStack_4b;
  undefined5 local_48;
  undefined3 uStack_43;
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  local_310 = matrix;
  (*(this->
    super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SLinSolver[6])(&local_a0,this);
  pUVar1 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).u;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.list.next = (Dring *)pUVar1;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.list.prev = (Dring *)pUVar1;
  pCVar2 = &(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).u.col;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.list.next = &pCVar2->list;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.list.prev = &pCVar2->list;
  this->usetup = false;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.updateType = this->uptype;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.firstUpdate = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.firstUnused = 0;
  if ((this->
      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedim == dm) {
    pnVar3 = &this->minStability;
    local_398.fpclass = cpp_dec_float_finite;
    local_398.prec_elem = 10;
    local_398.data._M_elems[0] = 0;
    local_398.data._M_elems[1] = 0;
    local_398.data._M_elems[2] = 0;
    local_398.data._M_elems[3] = 0;
    local_398.data._M_elems[4] = 0;
    local_398.data._M_elems[5] = 0;
    local_398.data._M_elems._24_5_ = 0;
    local_398.data._M_elems[7]._1_3_ = 0;
    local_398.data._M_elems._32_5_ = 0;
    local_398.data._M_elems[9]._1_3_ = 0;
    local_398.exp = 0;
    local_398.neg = false;
    local_358.fpclass = cpp_dec_float_finite;
    local_358.prec_elem = 10;
    local_358.data._M_elems[0] = 0;
    local_358.data._M_elems[1] = 0;
    local_358.data._M_elems[2] = 0;
    local_358.data._M_elems[3] = 0;
    local_358.data._M_elems[4] = 0;
    local_358.data._M_elems[5] = 0;
    local_358.data._M_elems._24_5_ = 0;
    local_358.data._M_elems[7]._1_3_ = 0;
    local_358.data._M_elems._32_5_ = 0;
    local_358.data._M_elems[9]._1_3_ = 0;
    local_358.exp = 0;
    local_358.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_358,2.0);
    if (&local_398 != &pnVar3->m_backend) {
      uVar6 = *(undefined8 *)((this->minStability).m_backend.data._M_elems + 8);
      local_398.data._M_elems._32_5_ = SUB85(uVar6,0);
      local_398.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_398.data._M_elems._0_8_ = *(undefined8 *)(pnVar3->m_backend).data._M_elems;
      local_398.data._M_elems._8_8_ =
           *(undefined8 *)((this->minStability).m_backend.data._M_elems + 2);
      local_398.data._M_elems._16_8_ =
           *(undefined8 *)((this->minStability).m_backend.data._M_elems + 4);
      uVar6 = *(undefined8 *)((this->minStability).m_backend.data._M_elems + 6);
      local_398.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_398.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_398.exp = (this->minStability).m_backend.exp;
      local_398.neg = (this->minStability).m_backend.neg;
      local_398.fpclass = (this->minStability).m_backend.fpclass;
      local_398.prec_elem = (this->minStability).m_backend.prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&local_398,&local_358);
    if (((local_a0.fpclass != cpp_dec_float_NaN) && (local_398.fpclass != cpp_dec_float_NaN)) &&
       (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_a0,&local_398), 0 < iVar14)) {
      local_2e8 = *(undefined8 *)((this->minThreshold).m_backend.data._M_elems + 8);
      local_308 = *(uint (*) [2])(this->minThreshold).m_backend.data._M_elems;
      auStack_300 = *(uint (*) [2])((this->minThreshold).m_backend.data._M_elems + 2);
      local_2f8 = *(uint (*) [2])((this->minThreshold).m_backend.data._M_elems + 4);
      uStack_2f0 = *(undefined8 *)((this->minThreshold).m_backend.data._M_elems + 6);
      iVar14 = (this->minThreshold).m_backend.exp;
      bVar13 = (this->minThreshold).m_backend.neg;
      fVar4 = (this->minThreshold).m_backend.fpclass;
      iVar5 = (this->minThreshold).m_backend.prec_elem;
      local_1d8 = *(undefined8 *)(this->minThreshold).m_backend.data._M_elems;
      uStack_1d0 = *(undefined8 *)((this->minThreshold).m_backend.data._M_elems + 2);
      local_1c8 = *(undefined8 *)((this->minThreshold).m_backend.data._M_elems + 4);
      uStack_1c0 = *(undefined8 *)((this->minThreshold).m_backend.data._M_elems + 6);
      local_1b8 = *(undefined8 *)((this->minThreshold).m_backend.data._M_elems + 8);
      pTVar7 = (this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var8 = (this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        }
      }
      local_1b0 = iVar14;
      local_1ac = bVar13;
      local_1a8 = fVar4;
      local_1a4 = iVar5;
      RVar10 = Tolerances::epsilon(pTVar7);
      betterThreshold<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_398,(soplex *)&local_1d8,th,RVar10);
      if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
      }
      fVar16 = local_398.fpclass;
      while (((fVar16 != cpp_dec_float_NaN &&
              ((this->lastThreshold).m_backend.fpclass != cpp_dec_float_NaN)) &&
             (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_398,&(this->lastThreshold).m_backend),
             bVar12 = local_398.neg, iVar17 = local_398.exp, iVar15 < 0))) {
        local_2e8 = CONCAT35(local_398.data._M_elems[9]._1_3_,local_398.data._M_elems._32_5_);
        uStack_2f0 = CONCAT35(local_398.data._M_elems[7]._1_3_,local_398.data._M_elems._24_5_);
        local_2f8[0] = local_398.data._M_elems[4];
        local_2f8[1] = local_398.data._M_elems[5];
        local_308[0] = local_398.data._M_elems[0];
        local_308[1] = local_398.data._M_elems[1];
        auStack_300[0] = local_398.data._M_elems[2];
        auStack_300[1] = local_398.data._M_elems[3];
        fVar4 = local_398.fpclass;
        iVar5 = local_398.prec_elem;
        local_208[0] = local_398.data._M_elems[4];
        local_208[1] = local_398.data._M_elems[5];
        local_218 = (soplex  [8])local_398.data._M_elems._0_8_;
        auStack_210[0] = local_398.data._M_elems[2];
        auStack_210[1] = local_398.data._M_elems[3];
        local_1f0 = local_398.exp;
        local_1ec = local_398.neg;
        local_1e8 = local_398.fpclass;
        local_1e4 = local_398.prec_elem;
        pTVar7 = (this->
                 super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        p_Var8 = (this->
                 super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          }
        }
        uStack_200 = uStack_2f0;
        local_1f8 = local_2e8;
        RVar10 = Tolerances::epsilon(pTVar7);
        betterThreshold<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_358,local_218,th_00,RVar10);
        local_398.data._M_elems._32_5_ = local_358.data._M_elems._32_5_;
        local_398.data._M_elems[9]._1_3_ = local_358.data._M_elems[9]._1_3_;
        local_398.data._M_elems[4] = local_358.data._M_elems[4];
        local_398.data._M_elems[5] = local_358.data._M_elems[5];
        local_398.data._M_elems._24_5_ = local_358.data._M_elems._24_5_;
        local_398.data._M_elems[7]._1_3_ = local_358.data._M_elems[7]._1_3_;
        local_398.data._M_elems[0] = local_358.data._M_elems[0];
        local_398.data._M_elems[1] = local_358.data._M_elems[1];
        local_398.data._M_elems[2] = local_358.data._M_elems[2];
        local_398.data._M_elems[3] = local_358.data._M_elems[3];
        local_398.exp = local_358.exp;
        local_398.neg = local_358.neg;
        local_398.fpclass = local_358.fpclass;
        local_398.prec_elem = local_358.prec_elem;
        uVar18 = local_358._48_8_;
        if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          uVar18 = local_398._48_8_ & 0xffffffff;
        }
        fVar16 = (fpclass_type)uVar18;
        iVar14 = iVar17;
        bVar13 = bVar12;
      }
      *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 8) = local_2e8;
      *(uint (*) [2])((this->lastThreshold).m_backend.data._M_elems + 4) = local_2f8;
      *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 6) = uStack_2f0;
      *(uint (*) [2])(this->lastThreshold).m_backend.data._M_elems = local_308;
      *(uint (*) [2])((this->lastThreshold).m_backend.data._M_elems + 2) = auStack_300;
      (this->lastThreshold).m_backend.exp = iVar14;
      (this->lastThreshold).m_backend.neg = bVar13;
      (this->lastThreshold).m_backend.fpclass = fVar4;
      (this->lastThreshold).m_backend.prec_elem = iVar5;
      local_38._0_4_ = cpp_dec_float_finite;
      local_38._4_4_ = 10;
      local_68._0_4_ = 0;
      local_68._4_4_ = 0;
      auStack_60[0] = 0;
      auStack_60[1] = 0;
      auStack_60[2] = 0;
      auStack_60[3] = 0;
      uStack_50 = 0;
      uStack_4b = 0;
      local_48 = 0;
      uStack_43 = 0;
      local_40 = 0;
      local_3c = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_68,0.04);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_358,2,(type *)0x0);
      local_d8.data._M_elems[9]._1_3_ = uStack_43;
      local_d8.data._M_elems._32_5_ = local_48;
      local_d8.data._M_elems[7]._1_3_ = uStack_4b;
      local_d8.data._M_elems._24_5_ = uStack_50;
      local_d8.data._M_elems[4] = auStack_60[2];
      local_d8.data._M_elems[5] = auStack_60[3];
      local_d8.data._M_elems[0] = (uint)local_68;
      local_d8.data._M_elems[1] = local_68._4_4_;
      local_d8.data._M_elems[2] = auStack_60[0];
      local_d8.data._M_elems[3] = auStack_60[1];
      local_d8.exp = local_40;
      local_d8.neg = (bool)local_3c;
      local_d8.fpclass = (fpclass_type)local_38;
      local_d8.prec_elem = local_38._4_4_;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&local_d8,&local_358);
      *(undefined8 *)((this->minStability).m_backend.data._M_elems + 8) =
           local_d8.data._M_elems._32_8_;
      *(undefined8 *)((this->minStability).m_backend.data._M_elems + 4) =
           local_d8.data._M_elems._16_8_;
      *(undefined8 *)((this->minStability).m_backend.data._M_elems + 6) =
           local_d8.data._M_elems._24_8_;
      *(undefined8 *)(pnVar3->m_backend).data._M_elems = local_d8.data._M_elems._0_8_;
      *(undefined8 *)((this->minStability).m_backend.data._M_elems + 2) =
           local_d8.data._M_elems._8_8_;
      (this->minStability).m_backend.exp = local_d8.exp;
      (this->minStability).m_backend.neg = local_d8.neg;
      (this->minStability).m_backend.fpclass = local_d8.fpclass;
      (this->minStability).m_backend.prec_elem = local_d8.prec_elem;
    }
  }
  else {
    (*(this->
      super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SLinSolver[2])(this);
    (this->
    super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedim = dm;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->vec,dm,true);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->ssvec,
            (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thedim);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->eta,
            (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thedim);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->forest,
            (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thedim);
    (this->
    super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).work = (this->vec).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).row.perm,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedim);
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).row.orig,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedim);
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).col.perm,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedim);
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).col.orig,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedim);
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::resize(&(this->
              super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).diag,(long)(this->
                           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).thedim);
    spx_realloc<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Dring*>
              (&(this->
                super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).u.row.elem,
               (this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedim);
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).u.row.len,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedim + 1);
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).u.row.max,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedim + 1);
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).u.row.start,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedim + 1);
    spx_realloc<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Dring*>
              (&(this->
                super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).u.col.elem,
               (this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedim);
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).u.col.len,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedim + 1);
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).u.col.max,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedim + 1);
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).u.col.start,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedim + 1);
    iVar14 = (this->
             super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedim + 1000;
    (this->
    super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).l.startSize = iVar14;
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).l.row,iVar14);
    spx_realloc<int*>(&(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).l.start,
                      (this->
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).l.startSize);
  }
  local_318 = &this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  iVar14 = (this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedim;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.list.idx = iVar14;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.start[iVar14] = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.max
  [(this->
   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).thedim] = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.len
  [(this->
   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).thedim] = 0;
  iVar14 = (this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedim;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.list.idx = iVar14;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.start[iVar14] = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.max
  [(this->
   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).thedim] = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.len
  [(this->
   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).thedim] = 0;
  pnVar3 = &this->lastThreshold;
  while( true ) {
    (this->
    super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).stat = OK;
    local_158.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 8);
    local_158.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar3->m_backend).data._M_elems;
    local_158.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 2);
    local_158.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 4);
    local_158.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 6);
    local_158.m_backend.exp = (this->lastThreshold).m_backend.exp;
    local_158.m_backend.neg = (this->lastThreshold).m_backend.neg;
    local_158.m_backend.fpclass = (this->lastThreshold).m_backend.fpclass;
    local_158.m_backend.prec_elem = (this->lastThreshold).m_backend.prec_elem;
    pTVar7 = (this->
             super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    p_Var8 = (this->
             super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      }
    }
    RVar10 = Tolerances::epsilonFactorization(pTVar7);
    local_e8 = 0xa00000000;
    local_118 = 0;
    uStack_110 = 0;
    local_108 = 0;
    uStack_100 = 0;
    uStack_fb = 0;
    uStack_f8 = 0;
    uStack_f3 = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_118,RVar10);
    CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::factor(local_318,local_310,&local_158,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_118);
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
    (*(this->
      super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SLinSolver[6])(&local_358,this);
    if (((local_358.fpclass != cpp_dec_float_NaN) &&
        ((this->minStability).m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_358,&(this->minStability).m_backend), -1 < iVar14)) break;
    uVar6 = *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 8);
    local_398.data._M_elems._32_5_ = SUB85(uVar6,0);
    local_398.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_398.data._M_elems._0_8_ = *(undefined8 *)(pnVar3->m_backend).data._M_elems;
    local_398.data._M_elems._8_8_ =
         *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 2);
    local_398.data._M_elems._16_8_ =
         *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 4);
    uVar6 = *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 6);
    local_398.data._M_elems._24_5_ = SUB85(uVar6,0);
    local_398.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    iVar14 = (this->lastThreshold).m_backend.exp;
    bVar13 = (this->lastThreshold).m_backend.neg;
    fVar4 = (this->lastThreshold).m_backend.fpclass;
    iVar5 = (this->lastThreshold).m_backend.prec_elem;
    local_258 = *(undefined8 *)(pnVar3->m_backend).data._M_elems;
    uStack_250 = *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 2);
    local_248 = *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 4);
    uStack_240 = *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 6);
    local_238 = *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 8);
    pTVar7 = (this->
             super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    p_Var8 = (this->
             super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      }
    }
    local_230 = iVar14;
    local_22c = bVar13;
    local_228 = fVar4;
    local_224 = iVar5;
    RVar10 = Tolerances::epsilon(pTVar7);
    betterThreshold<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_358,(soplex *)&local_258,th_01,RVar10);
    *(ulong *)((this->lastThreshold).m_backend.data._M_elems + 8) =
         CONCAT35(local_358.data._M_elems[9]._1_3_,local_358.data._M_elems._32_5_);
    *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 4) =
         local_358.data._M_elems._16_8_;
    *(ulong *)((this->lastThreshold).m_backend.data._M_elems + 6) =
         CONCAT35(local_358.data._M_elems[7]._1_3_,local_358.data._M_elems._24_5_);
    *(undefined8 *)(pnVar3->m_backend).data._M_elems = local_358.data._M_elems._0_8_;
    *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 2) =
         local_358.data._M_elems._8_8_;
    (this->lastThreshold).m_backend.exp = local_358.exp;
    (this->lastThreshold).m_backend.neg = local_358.neg;
    (this->lastThreshold).m_backend.fpclass = local_358.fpclass;
    (this->lastThreshold).m_backend.prec_elem = local_358.prec_elem;
    iVar17 = local_358.exp;
    uVar19 = local_358.neg;
    fVar16 = local_358.fpclass;
    iVar20 = local_358.prec_elem;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
      iVar17 = (this->lastThreshold).m_backend.exp;
      uVar19 = (this->lastThreshold).m_backend.neg;
      fVar16 = (this->lastThreshold).m_backend.fpclass;
      iVar20 = (this->lastThreshold).m_backend.prec_elem;
    }
    local_298.m_backend.data._M_elems[7]._1_3_ = local_398.data._M_elems[7]._1_3_;
    local_298.m_backend.data._M_elems._24_5_ = local_398.data._M_elems._24_5_;
    local_298.m_backend.data._M_elems[0] = local_398.data._M_elems[0];
    local_298.m_backend.data._M_elems[1] = local_398.data._M_elems[1];
    local_298.m_backend.data._M_elems[2] = local_398.data._M_elems[2];
    local_298.m_backend.data._M_elems[3] = local_398.data._M_elems[3];
    local_298.m_backend.data._M_elems[4] = local_398.data._M_elems[4];
    local_298.m_backend.data._M_elems[5] = local_398.data._M_elems[5];
    local_298.m_backend.data._M_elems[9]._1_3_ = local_398.data._M_elems[9]._1_3_;
    local_298.m_backend.data._M_elems._32_5_ = local_398.data._M_elems._32_5_;
    local_2d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar3->m_backend).data._M_elems;
    local_2d8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 2);
    local_2d8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 4);
    local_2d8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 6);
    local_2d8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 8);
    pTVar7 = (this->
             super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    p_Var8 = (this->
             super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      }
    }
    local_2d8.m_backend.exp = iVar17;
    local_2d8.m_backend.neg = (bool)uVar19;
    local_2d8.m_backend.fpclass = fVar16;
    local_2d8.m_backend.prec_elem = iVar20;
    local_298.m_backend.exp = iVar14;
    local_298.m_backend.neg = bVar13;
    local_298.m_backend.fpclass = fVar4;
    local_298.m_backend.prec_elem = iVar5;
    RVar10 = Tolerances::epsilon(pTVar7);
    bVar13 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_298,&local_2d8,RVar10);
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
    if (bVar13) break;
    local_358.fpclass = cpp_dec_float_finite;
    local_358.prec_elem = 10;
    local_358.data._M_elems[0] = 0;
    local_358.data._M_elems[1] = 0;
    local_358.data._M_elems[2] = 0;
    local_358.data._M_elems[3] = 0;
    local_358.data._M_elems[4] = 0;
    local_358.data._M_elems[5] = 0;
    local_358.data._M_elems._24_5_ = 0;
    local_358.data._M_elems[7]._1_3_ = 0;
    local_358.data._M_elems._32_5_ = 0;
    local_358.data._M_elems[9]._1_3_ = 0;
    local_358.exp = 0;
    local_358.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_358,2.0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
              (&(this->minStability).m_backend,&local_358);
    pSVar9 = (this->
             super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    if ((pSVar9 != (SPxOut *)0x0) && (4 < (int)pSVar9->m_verbosity)) {
      local_358.data._M_elems[0] = pSVar9->m_verbosity;
      local_d8.data._M_elems[0] = 5;
      (*pSVar9->_vptr_SPxOut[2])(pSVar9,&local_d8);
      pSVar9 = (this->
               super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar9->m_streams[pSVar9->m_verbosity],
                 "ISLUFA01 refactorizing with increased Markowitz threshold: ",0x3b);
      local_198.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar3->m_backend).data._M_elems;
      local_198.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 2);
      local_198.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 4);
      local_198.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 6);
      local_198.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->lastThreshold).m_backend.data._M_elems + 8);
      local_198.m_backend.exp = (this->lastThreshold).m_backend.exp;
      local_198.m_backend.neg = (this->lastThreshold).m_backend.neg;
      local_198.m_backend.fpclass = (this->lastThreshold).m_backend.fpclass;
      local_198.m_backend.prec_elem = (this->lastThreshold).m_backend.prec_elem;
      boost::multiprecision::operator<<(pSVar9->m_streams[pSVar9->m_verbosity],&local_198);
      cVar11 = (char)pSVar9->m_streams[pSVar9->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar9->m_streams[pSVar9->m_verbosity] + -0x18)
                      + cVar11);
      std::ostream::put(cVar11);
      std::ostream::flush();
      pSVar9 = (this->
               super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      (*pSVar9->_vptr_SPxOut[2])(pSVar9,&local_358);
    }
  }
  (*(this->
    super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SLinSolver[6])(&local_358,this);
  return (this->
         super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).stat;
}

Assistant:

typename SLUFactor<R>::Status SLUFactor<R>::load(const SVectorBase<R>* matrix[], int dm)
{
   assert(dm     >= 0);
   assert(matrix != nullptr);

   R lastStability = stability();

   initDR(this->u.row.list);
   initDR(this->u.col.list);

   usetup        = false;
   this->l.updateType  = uptype;
   this->l.firstUpdate = 0;
   this->l.firstUnused = 0;

   if(dm != this->thedim)
   {
      clear();

      this->thedim = dm;
      vec.reDim(this->thedim);
      ssvec.reDim(this->thedim);
      eta.reDim(this->thedim);
      forest.reDim(this->thedim);
      this->work = vec.get_ptr();

      spx_realloc(this->row.perm, this->thedim);
      spx_realloc(this->row.orig, this->thedim);
      spx_realloc(this->col.perm, this->thedim);
      spx_realloc(this->col.orig, this->thedim);
      this->diag.resize(this->thedim);

      spx_realloc(this->u.row.elem,  this->thedim);
      spx_realloc(this->u.row.len,   this->thedim + 1);
      spx_realloc(this->u.row.max,   this->thedim + 1);
      spx_realloc(this->u.row.start, this->thedim + 1);

      spx_realloc(this->u.col.elem,  this->thedim);
      spx_realloc(this->u.col.len,   this->thedim + 1);
      spx_realloc(this->u.col.max,   this->thedim + 1);
      spx_realloc(this->u.col.start, this->thedim + 1);

      this->l.startSize = this->thedim + SOPLEX_MAXUPDATES;

      spx_realloc(this->l.row,   this->l.startSize);
      spx_realloc(this->l.start, this->l.startSize);
   }
   // the last factorization was reasonably stable, so we decrease the Markowitz threshold (stored in lastThreshold) in
   // order to favour sparsity
   else if(lastStability > 2.0 * minStability)
   {
      // we reset lastThreshold to its previous value in the sequence minThreshold, betterThreshold(minThreshold),
      // betterThreshold(betterThreshold(minThreshold)), ...
      R last   = minThreshold;
      R better = betterThreshold(last, this->tolerances()->epsilon());

      while(better < lastThreshold)
      {
         last   = better;
         better = betterThreshold(last, this->tolerances()->epsilon());
      }

      lastThreshold = last;

      // we reset the minimum stability (which might have been decreased below) to ensure that the increased sparsity
      // does not hurt the stability
      minStability  = 2 * SOPLEX_MINSTABILITY;
   }

   this->u.row.list.idx      = this->thedim;
   this->u.row.start[this->thedim] = 0;
   this->u.row.max[this->thedim]   = 0;
   this->u.row.len[this->thedim]   = 0;

   this->u.col.list.idx      = this->thedim;
   this->u.col.start[this->thedim] = 0;
   this->u.col.max[this->thedim]   = 0;
   this->u.col.len[this->thedim]   = 0;

   for(;;)
   {
      ///@todo if the factorization fails with stat = SINGULAR, distinuish between proven singularity (e.g., because of
      ///an empty column) and singularity due to numerics, that could be avoided by changing minStability and
      ///lastThreshold; in the first case, we want to abort, otherwise change the numerics
      this->stat = this->OK;
      this->factor(matrix, lastThreshold, this->tolerances()->epsilonFactorization());

      // finish if the factorization is stable
      if(stability() >= minStability)
         break;

      // otherwise, we increase the Markowitz threshold
      R x = lastThreshold;
      lastThreshold = betterThreshold(lastThreshold, this->tolerances()->epsilon());

      // until it doesn't change anymore at its maximum value
      if(EQ(x, lastThreshold, this->tolerances()->epsilon()))
         break;

      // we relax the stability requirement
      minStability /= 2.0;

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) <<
                    "ISLUFA01 refactorizing with increased Markowitz threshold: "
                    << lastThreshold << std::endl;)
   }

   SPxOut::debug(this, "DSLUFA02 threshold = {} \tstability = {}\tminStability = {}\n", lastThreshold,
                 stability(), minStability);
   SPX_DEBUG(
   {
      int i;
      FILE* fl = fopen("dump.lp", "w");
      std::cout << "DSLUFA03 Basis:\n";
      int j = 0;

      for(i = 0; i < dim(); ++i)
         j += matrix[i]->size();
      for(i = 0; i < dim(); ++i)
      {
         for(j = 0; j < matrix[i]->size(); ++j)
         {
            fprintf(fl, "%8d  %8d  ",
                    i + 1, matrix[i]->index(j) + 1);
            std::cout << matrix[i]->value(j) << std::endl;
         }
      }
      fclose(fl);
      std::cout << "DSLUFA04 LU-Factors:" << std::endl;
      dump();

      std::cout << "DSLUFA05 threshold = " << lastThreshold
                << "\tstability = " << stability() << std::endl;
   }
   )

   assert(isConsistent());
   return Status(this->stat);
}